

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::WriteBricks(brick_pool *Bp,cstr FileName)

{
  idx2_file *piVar1;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar6;
  v3<int> Var;
  v3<int> Var_00;
  v3<int> Var_01;
  v3<int> Var_02;
  v3<int> Var_03;
  FILE *Fp;
  int local_ac;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_a8;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2SparseBricks_cpp:209:3)>
  __ScopeGuard__209;
  grid local_88;
  brick_volume BrickVol;
  ulong uVar2;
  
  Fp = (FILE *)fopen(FileName,"wb");
  __ScopeGuard__209.Dismissed = false;
  if ((FILE *)Fp == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xd3;
    uVar3 = 10;
    __ScopeGuard__209.Func.Fp = &Fp;
  }
  else {
    piVar1 = Bp->Idx2;
    Var.field_0.field_0.Y = 0;
    Var.field_0.field_0.X = (piVar1->Dims3).field_0.field_0.Z;
    Var.field_0._8_4_ = SUB84(piVar1,0);
    uVar2 = (ulong)piVar1 & 0xffffffff;
    __ScopeGuard__209.Func.Fp = &Fp;
    WritePOD<idx2::v3<int>>((idx2 *)Fp,(FILE *)(piVar1->Dims3).field_0.field_3.XY.field_0,Var);
    Var_00.field_0.field_0.Y = 0;
    Var_00.field_0.field_0.X = (Bp->Idx2->BrickDims3).field_0.field_0.Z;
    Var_00.field_0._8_4_ = (undefined4)uVar2;
    uVar2 = uVar2 & 0xffffffff;
    WritePOD<idx2::v3<int>>
              ((idx2 *)Fp,(FILE *)(Bp->Idx2->BrickDims3).field_0.field_3.XY.field_0,Var_00);
    Var_01.field_0.field_0.Y = 0;
    Var_01.field_0.field_0.X = (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Z;
    Var_01.field_0._8_4_ = (undefined4)uVar2;
    WritePOD<idx2::v3<int>>
              ((idx2 *)Fp,(FILE *)(Bp->Idx2->NBricks3).Arr[0].field_0.field_3.XY.field_0,Var_01);
    piVar1 = Bp->Idx2;
    for (uVar4 = 0; local_a8.field_0.Z = uVar4,
        (int)uVar4 < (piVar1->NBricks3).Arr[0].field_0.field_0.Z; uVar4 = uVar4 + 1) {
      uVar2 = 0;
      while( true ) {
        local_a8.field_0.Y = (int)uVar2;
        if ((piVar1->NBricks3).Arr[0].field_0.field_0.Y <= local_a8.field_0.Y) break;
        local_ac = local_a8.field_0.Y;
        for (iVar5 = 0; local_a8.field_0.X = iVar5,
            iVar5 < (piVar1->NBricks3).Arr[0].field_0.field_0.X; iVar5 = iVar5 + 1) {
          Var_02.field_0.field_0.Y = 0;
          Var_02.field_0.field_0.X = uVar4;
          Var_02.field_0._8_4_ = (undefined4)uVar2;
          WritePOD<idx2::v3<int>>((idx2 *)Fp,(FILE *)CONCAT44(local_a8.field_0.Y,iVar5),Var_02);
          GetBrickVolume(&BrickVol,Bp,(v3i *)&local_a8.field_0);
          Var_03.field_0._0_8_ = (long)(BrickVol.ExtentLocal.Dims * 2) >> 0x2b;
          Var_03.field_0.field_0.Z = 0;
          uVar2 = 0;
          WritePOD<idx2::v3<int>>
                    ((idx2 *)Fp,
                     (FILE *)((long)(BrickVol.ExtentLocal.Dims << 0x16) >> 0xb & 0xffffffff00000000U
                             | (ulong)(uint)((long)(BrickVol.ExtentLocal.Dims << 0x2b) >> 0x2b)),
                     Var_03);
          local_88.super_extent.From = BrickVol.ExtentLocal.From;
          local_88.super_extent.Dims = BrickVol.ExtentLocal.Dims;
          local_88.Strd = 0x40000200001;
          WriteVolume(Fp,&BrickVol.Vol,&local_88);
          piVar1 = Bp->Idx2;
        }
        uVar2 = (ulong)(local_ac + 1);
      }
    }
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe5;
    uVar3 = 0;
  }
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp:209:3)>
  ::~scope_guard(&__ScopeGuard__209);
  eVar6.Code = (char)uVar3;
  eVar6.StackIdx = (char)((uint)uVar3 >> 8);
  eVar6.StrGened = (bool)(char)((uint)uVar3 >> 0x10);
  eVar6._11_1_ = (char)((uint)uVar3 >> 0x18);
  eVar6.Msg = "";
  eVar6._12_4_ = 0;
  return eVar6;
}

Assistant:

error<idx2_err_code>
WriteBricks(brick_pool* Bp, cstr FileName)
{
  idx2_RAII(FILE*, Fp = fopen(FileName, "wb"), , if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(idx2_err_code::FileCreateFailed);

  WritePOD(Fp, Bp->Idx2->Dims3);
  WritePOD(Fp, Bp->Idx2->BrickDims3);
  WritePOD(Fp, Bp->Idx2->NBricks3[0]);

  v3i B3;
  idx2_BeginFor3 (B3, v3i(0), Bp->Idx2->NBricks3[0], v3i(1))
  {
    //u64 BrickIndex = GetLinearBrick(*Bp->Idx2, 0, B3);
    WritePOD(Fp, B3);
    brick_volume BrickVol = GetBrickVolume(Bp, B3);
    v3i D3 = Dims(BrickVol.ExtentLocal);
    WritePOD(Fp, Dims(BrickVol.ExtentLocal));
    v3i F3 = From(BrickVol.ExtentLocal);
    WriteVolume(Fp, BrickVol.Vol, grid(BrickVol.ExtentLocal));
  } idx2_EndFor3

  return idx2_Error(idx2_err_code::NoError);
}